

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O0

size_t wasm::ThreadPool::getNumCores(void)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  allocator<char> local_39;
  string local_38;
  uint local_18 [2];
  ulong local_10;
  size_t num;
  
  local_18[1] = 1;
  local_18[0] = std::thread::hardware_concurrency();
  puVar2 = std::max<unsigned_int>(local_18 + 1,local_18);
  local_10 = (ulong)*puVar2;
  pcVar3 = getenv("BINARYEN_CORES");
  if (pcVar3 != (char *)0x0) {
    pcVar3 = getenv("BINARYEN_CORES");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar3,&local_39);
    iVar1 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
    local_10 = (ulong)iVar1;
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return local_10;
}

Assistant:

size_t ThreadPool::getNumCores() {
#if defined(__EMSCRIPTEN__) && !defined(__EMSCRIPTEN_PTHREADS__)
  // In an Emscripten build without pthreads support, avoid the overhead of
  // including support code for the below runtime checks.
  return 1;
#else
  size_t num = std::max(1U, std::thread::hardware_concurrency());
  if (getenv("BINARYEN_CORES")) {
    num = std::stoi(getenv("BINARYEN_CORES"));
  }
  return num;
#endif
}